

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdlib.cpp
# Opt level: O3

FString NicePath(char *path)

{
  __uid_t __uid;
  passwd *ppVar1;
  char *pcVar2;
  size_t sVar3;
  char *in_RSI;
  FString who;
  FString local_30;
  
  if (in_RSI == (char *)0x0) {
LAB_004ad9b2:
    FString::FString((FString *)path,(char *)"");
  }
  else {
    if (*in_RSI == '~') {
      if ((in_RSI[1] == '/') || (in_RSI[1] == '\0')) {
        pcVar2 = in_RSI + 1;
        __uid = getuid();
        ppVar1 = getpwuid(__uid);
      }
      else {
        pcVar2 = strchr(in_RSI,0x2f);
        if (pcVar2 == (char *)0x0) {
          sVar3 = strlen(in_RSI);
          pcVar2 = in_RSI + sVar3;
        }
        FString::FString(&local_30,in_RSI,(long)pcVar2 - (long)in_RSI);
        ppVar1 = getpwnam(local_30.Chars);
        FString::~FString(&local_30);
      }
      if (ppVar1 != (passwd *)0x0) {
        FString::FString((FString *)path,ppVar1->pw_dir);
        if (*pcVar2 == '\0') {
          return (FString)path;
        }
        ExpandEnvVars((char *)&local_30);
        FString::operator+=((FString *)path,&local_30);
        FString::~FString(&local_30);
        return (FString)path;
      }
    }
    else if (*in_RSI == '\0') goto LAB_004ad9b2;
    ExpandEnvVars(path);
  }
  return (FString)path;
}

Assistant:

FString NicePath(const char *path)
{
#ifdef _WIN32
	return ExpandEnvVars(path);
#else
	if (path == NULL || *path == '\0')
	{
		return FString("");
	}
	if (*path != '~')
	{
		return ExpandEnvVars(path);
	}

	passwd *pwstruct;
	const char *slash;

	if (path[1] == '/' || path[1] == '\0')
	{ // Get my home directory
		pwstruct = getpwuid(getuid());
		slash = path + 1;
	}
	else
	{ // Get somebody else's home directory
		slash = strchr(path, '/');
		if (slash == NULL)
		{
			slash = path + strlen(path);
		}
		FString who(path, slash - path);
		pwstruct = getpwnam(who);
	}
	if (pwstruct == NULL)
	{
		return ExpandEnvVars(path);
	}
	FString where(pwstruct->pw_dir);
	if (*slash != '\0')
	{
		where += ExpandEnvVars(slash);
	}
	return where;
#endif
}